

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O0

size_t ap_str_strlcpy(char *dst,char *src,size_t size)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_t local_38;
  size_t n;
  char *s;
  char *d;
  size_t size_local;
  char *src_local;
  char *dst_local;
  
  local_38 = size;
  n = (size_t)src;
  s = dst;
  if (size != 0) {
    do {
      local_38 = local_38 - 1;
      if (local_38 == 0) break;
      sVar2 = n + 1;
      cVar1 = *(char *)n;
      pcVar3 = s + 1;
      *s = cVar1;
      n = sVar2;
      s = pcVar3;
    } while (cVar1 != '\0');
  }
  if (local_38 == 0) {
    if (size != 0) {
      *s = '\0';
    }
    do {
      sVar2 = n + 1;
      cVar1 = *(char *)n;
      n = sVar2;
    } while (cVar1 != '\0');
  }
  return (n - (long)src) - 1;
}

Assistant:

size_t ap_str_strlcpy (char *dst, const char *src, size_t size)
{
	char		*d		= dst;
	const char	*s		= src;
	size_t		n		= size;

	/* Copy as many bytes as will fit */
	if (n != 0)
	{
		while (--n != 0)
		{
			if ((*d++ = *s++) == '\0')
			{
				break;
			}
		}
	}

	/* Not enough room in dst, add NUL and traverse rest of src */
	if (n == 0)
	{
		if (size != 0)
		{
			*d = '\0'; /* NUL-terminate dst */
		}
		
		while (*s++);
	}

	return(s - src - 1); /* count does not include NUL */
}